

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void continuous_dist_test_streamable<trng::truncated_normal_dist<double>>
               (truncated_normal_dist<double> *d)

{
  bool bVar1;
  StringRef local_288;
  param_type p_new;
  truncated_normal_dist<double> d_new;
  AssertionHandler catchAssertionHandler;
  StringRef local_1c8;
  SourceLineInfo local_1b8;
  stringstream str;
  basic_ostream<char,_std::char_traits<char>_> local_198 [376];
  
  trng::truncated_normal_dist<double>::param_type::param_type(&p_new);
  std::__cxx11::stringstream::stringstream((stringstream *)&str);
  trng::operator<<(local_198,&d->P);
  trng::operator>>((basic_istream<char,_std::char_traits<char>_> *)&str,&p_new);
  d_new.P.Phi_a = p_new.Phi_a;
  d_new.P.Phi_b = p_new.Phi_b;
  d_new.P.a_ = p_new.a_;
  d_new.P.b_ = p_new.b_;
  d_new.P.mu_ = p_new.mu_;
  d_new.P.sigma_ = p_new.sigma_;
  local_288.m_start = "REQUIRE";
  local_288.m_size = 7;
  local_1b8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_1b8.line = 0xcd;
  Catch::StringRef::StringRef(&local_1c8,"(d == d_new)");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,&local_288,&local_1b8,local_1c8,Normal);
  bVar1 = trng::operator==(&d->P,&d_new.P);
  local_288.m_start = (char *)CONCAT71(local_288.m_start._1_7_,bVar1);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_288);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  std::__cxx11::stringstream::~stringstream((stringstream *)&str);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}